

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockT
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,HeapBucket *bucket,
          ushort objectSize,ushort objectCount,HeapBlockType heapBlockType)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  ushort objectCount_00;
  uint bucketIndex;
  undefined4 uVar4;
  undefined7 in_register_00000081;
  undefined8 *in_FS_OFFSET;
  ValidPointers<SmallAllocationBlockAttributes> local_58;
  HeapBucket *local_48;
  undefined4 local_3c;
  undefined4 local_38;
  uint local_34;
  
  uVar4 = (undefined4)CONCAT71(in_register_00000081,heapBlockType);
  local_3c = (undefined4)CONCAT62(in_register_0000000a,objectCount);
  local_48 = bucket;
  HeapBlock::HeapBlock(&this->super_HeapBlock,heapBlockType);
  (this->super_HeapBlock)._vptr_HeapBlock = (_func_int **)&PTR_WBSetBit_0035a968;
  local_34 = (uint)objectSize;
  if (((int)CONCAT62(in_register_00000012,objectSize) == 0) ||
     (0x300 < local_34 || (objectSize & 0xf) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0xc4,"(IsAlignedSmallObjectSize(sizeCat))",
                       "IsAlignedSmallObjectSize(sizeCat)");
    if (!bVar3) goto LAB_0020a3e4;
    *puVar1 = 0;
  }
  bucketIndex = (int)((CONCAT62(in_register_00000012,objectSize) & 0xffffffff) >> 4) - 1;
  local_38 = uVar4;
  if (0x2f < bucketIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x17c,"(bucketIndex < TBlockAttributes::BucketCount)",
                       "bucketIndex < TBlockAttributes::BucketCount");
    if (!bVar3) goto LAB_0020a3e4;
    *puVar1 = 0;
  }
  ValidPointers<SmallAllocationBlockAttributes>::ValidPointers
            (&local_58,HeapInfo::smallAllocValidPointersMap.validPointersBuffer[bucketIndex],
             bucketIndex);
  (this->validPointers).validPointers = local_58.validPointers;
  (this->validPointers).indexPerObject = local_58.indexPerObject;
  (this->validPointers).maxObjectIndex = local_58.maxObjectIndex;
  if ((objectSize == 0) || (0x300 < local_34 || (objectSize & 0xf) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0xc4,"(IsAlignedSmallObjectSize(sizeCat))",
                       "IsAlignedSmallObjectSize(sizeCat)");
    if (!bVar3) {
LAB_0020a3e4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  this->bucketIndex = bucketIndex;
  this->objectSize = objectSize;
  objectCount_00 = (ushort)local_3c;
  this->objectCount = objectCount_00;
  memset(&this->freeBits,0,0xa0);
  ConstructorCommon(this,local_48,(ushort)local_34,objectCount_00,(HeapBlockType)local_38);
  return;
}

Assistant:

SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockT(HeapBucket * bucket, ushort objectSize, ushort objectCount, HeapBlockType heapBlockType)
    : HeapBlock(heapBlockType),
    bucketIndex(HeapInfo::GetBucketIndex(objectSize)),
    validPointers(HeapInfo::smallAllocValidPointersMap.GetValidPointersForIndex(HeapInfo::GetBucketIndex(objectSize))),
    objectSize(objectSize), objectCount(objectCount)
{
    ConstructorCommon(bucket, objectSize, objectCount, heapBlockType);
}